

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

bool __thiscall Node::removePredecessor(Node *this,Node *node)

{
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *this_00;
  size_t sVar1;
  Node *pNVar2;
  bool bVar3;
  pair<std::_Rb_tree_iterator<Node_*>,_std::_Rb_tree_iterator<Node_*>_> pVar4;
  Node *local_28;
  Node *local_20;
  
  if (node == (Node *)0x0) {
    bVar3 = false;
  }
  else {
    local_28 = node;
    pVar4 = std::
            _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
            ::equal_range(&(this->predecessors_)._M_t,&local_28);
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    _M_erase_aux(&(this->predecessors_)._M_t,(_Base_ptr)pVar4.first._M_node,
                 (_Base_ptr)pVar4.second._M_node);
    pNVar2 = local_28;
    this_00 = &local_28->successors_;
    local_20 = this;
    pVar4 = std::
            _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
            ::equal_range(&this_00->_M_t,&local_20);
    sVar1 = (pNVar2->successors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    _M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
    bVar3 = sVar1 != (pNVar2->successors_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  return bVar3;
}

Assistant:

bool Node::removePredecessor(Node *node) {
    if (!node) {
        return false;
    }
    predecessors_.erase(node);
    return node->successors_.erase(this);
}